

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

void ParseConstant(FScanner *sc,PSymbolTable *symt,PClassActor *cls)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  FxExpression *pFVar5;
  PSymbolConstNumeric *this;
  PSymbol *pPVar6;
  char *pcVar7;
  double dVar8;
  FName symname;
  ExpVal val;
  FName local_30;
  FName local_2c;
  
  bVar2 = FScanner::CheckToken(sc,0x140);
  if ((bVar2) || (bVar2 = FScanner::CheckToken(sc,0x134), bVar2)) {
    iVar1 = sc->TokenType;
    FScanner::MustGetToken(sc,0x101);
    FName::FName(&symname,sc->String);
    FScanner::MustGetToken(sc,0x3d);
    pFVar5 = ParseExpression(sc,cls,true);
    FScanner::MustGetToken(sc,0x3b);
    if (pFVar5 == (FxExpression *)0x0) {
      pcVar7 = "Error while resolving constant definition";
    }
    else {
      iVar3 = (*pFVar5->_vptr_FxExpression[3])(pFVar5);
      if ((char)iVar3 != '\0') {
        ExpVal::ExpVal(&val,(ExpVal *)(pFVar5 + 1));
        (*pFVar5->_vptr_FxExpression[1])(pFVar5);
        if (iVar1 == 0x140) {
          this = (PSymbolConstNumeric *)DObject::operator_new(0x38);
          local_2c.Index = symname.Index;
          PSymbolConstNumeric::PSymbolConstNumeric(this,&local_2c,(PType *)TypeSInt32);
          if ((val.Type)->RegType == '\x01') {
            uVar4 = (undefined4)(double)CONCAT44(val.field_1._4_4_,val.field_1.Int);
          }
          else {
            uVar4 = 0;
            if ((val.Type)->RegType == '\0') {
              uVar4 = val.field_1.Int;
            }
          }
          (this->field_0).Value = uVar4;
        }
        else {
          this = (PSymbolConstNumeric *)DObject::operator_new(0x38);
          local_30.Index = symname.Index;
          PSymbolConstNumeric::PSymbolConstNumeric(this,&local_30,(PType *)TypeFloat64);
          dVar8 = ExpVal::GetFloat(&val);
          (this->field_0).Float = dVar8;
        }
        pPVar6 = PSymbolTable::AddSymbol(symt,(PSymbol *)this);
        if (pPVar6 == (PSymbol *)0x0) {
          (*(this->super_PSymbolConst).super_PSymbol.super_PTypeBase.super_DObject._vptr_DObject[2])
                    (this);
          if (cls == (PClassActor *)0x0) {
            pcVar7 = "Global";
          }
          else {
            pcVar7 = FName::NameData.NameArray
                     [(cls->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      TypeName.Index].Text;
          }
          FScanner::ScriptMessage
                    (sc,"\'%s\' is already defined in \'%s\'.",
                     FName::NameData.NameArray[symname.Index].Text,pcVar7);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        ExpVal::~ExpVal(&val);
        return;
      }
      pcVar7 = "Constant definition is not a constant";
    }
  }
  else {
    pcVar7 = "Numeric type required for constant";
  }
  FScanner::ScriptMessage(sc,pcVar7);
  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  return;
}

Assistant:

static void ParseConstant (FScanner &sc, PSymbolTable *symt, PClassActor *cls)
{
	// Read the type and make sure it's int or float.
	if (sc.CheckToken(TK_Int) || sc.CheckToken(TK_Float))
	{
		int type = sc.TokenType;
		sc.MustGetToken(TK_Identifier);
		FName symname = sc.String;
		sc.MustGetToken('=');
		FxExpression *expr = ParseExpression (sc, cls, true);
		sc.MustGetToken(';');

		if (expr == nullptr)
		{
			sc.ScriptMessage("Error while resolving constant definition");
			FScriptPosition::ErrorCounter++;
		}
		else if (!expr->isConstant())
		{
			sc.ScriptMessage("Constant definition is not a constant");
			FScriptPosition::ErrorCounter++;
		}
		else
		{
			ExpVal val = static_cast<FxConstant *>(expr)->GetValue();
			delete expr;
			PSymbolConstNumeric *sym;
			if (type == TK_Int)
			{
				sym = new PSymbolConstNumeric(symname, TypeSInt32);
				sym->Value = val.GetInt();
			}
			else
			{
				sym = new PSymbolConstNumeric(symname, TypeFloat64);
				sym->Float = val.GetFloat();
			}
			if (symt->AddSymbol (sym) == NULL)
			{
				delete sym;
				sc.ScriptMessage ("'%s' is already defined in '%s'.",
					symname.GetChars(), cls? cls->TypeName.GetChars() : "Global");
				FScriptPosition::ErrorCounter++;
			}
		}
	}
	else
	{
		sc.ScriptMessage("Numeric type required for constant");
		FScriptPosition::ErrorCounter++;
	}
}